

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O2

TransactionContext * __thiscall
cfd::TransactionContext::GetTxOutAddress(TransactionContext *this,uint32_t index,NetType net_type)

{
  long lVar1;
  CfdException *this_00;
  NetType in_ECX;
  undefined4 in_register_00000034;
  Script local_80;
  AddressFactory address_factory;
  
  lVar1 = *(long *)(CONCAT44(in_register_00000034,index) + 0x30) -
          *(long *)(CONCAT44(in_register_00000034,index) + 0x28);
  if ((ulong)net_type < (ulong)(lVar1 / 0x50)) {
    AddressFactory::AddressFactory(&address_factory,in_ECX);
    cfd::core::AbstractTxOut::GetLockingScript();
    AddressFactory::GetAddressByLockingScript((AddressFactory *)this,(Script *)&address_factory);
    core::Script::~Script(&local_80);
    AddressFactory::~AddressFactory(&address_factory);
    return this;
  }
  this_00 = (CfdException *)__cxa_allocate_exception(0x30,0x50,lVar1 % 0x50);
  std::__cxx11::string::string
            ((string *)&local_80,"vout out_of_range error.",(allocator *)&address_factory);
  core::CfdException::CfdException(this_00,kCfdOutOfRangeError,(string *)&local_80);
  __cxa_throw(this_00,&core::CfdException::typeinfo,core::CfdException::~CfdException);
}

Assistant:

Address TransactionContext::GetTxOutAddress(
    uint32_t index, NetType net_type) const {
  if (vout_.size() <= index) {
    throw CfdException(
        CfdError::kCfdOutOfRangeError, "vout out_of_range error.");
  }
  AddressFactory address_factory(net_type);
  return address_factory.GetAddressByLockingScript(
      vout_[index].GetLockingScript());
}